

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

_Bool ts_parser__do_all_potential_reductions
                (TSParser *self,StackVersion starting_version,TSSymbol lookahead_symbol)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ReduceAction *pRVar5;
  ReduceAction *pRVar6;
  _Bool _Var7;
  TSParseAction *pTVar8;
  _Bool _Var9;
  byte bVar10;
  TSStateId state;
  uint uVar11;
  StackVersion v1;
  TSSymbol symbol;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  StackVersion version;
  uint32_t i;
  ulong uVar17;
  ulong uVar18;
  bool bVar19;
  ushort local_7e;
  TableEntry entry;
  
  uVar3 = (self->stack->heads).size;
  uVar12 = 0;
  _Var7 = false;
  uVar11 = uVar3;
  version = starting_version;
  do {
    uVar4 = uVar3;
    if (uVar11 <= version) {
      return _Var7;
    }
    while (uVar4 < version) {
      _Var9 = ts_stack_merge(self->stack,uVar4,version);
      uVar4 = uVar4 + 1;
      if (_Var9) goto LAB_0011e21e;
    }
    state = ts_stack_state(self->stack,version);
    (self->reduce_actions).size = 0;
    local_7e = lookahead_symbol + 1;
    symbol = lookahead_symbol;
    if (lookahead_symbol == 0) {
      local_7e = (ushort)self->language->token_count;
      symbol = 1;
    }
    bVar14 = 0;
    for (; uVar13 = 0, symbol < local_7e; symbol = symbol + 1) {
      ts_language_table_entry(self->language,state,symbol,&entry);
      pTVar8 = entry.actions;
      uVar17 = (ulong)entry.action_count;
      for (uVar13 = 0; uVar13 != uVar17; uVar13 = uVar13 + 1) {
        sVar1 = pTVar8[uVar13].params.field_1.dynamic_precedence;
        bVar10 = pTVar8[uVar13].field_0x6 & 0xf;
        if (bVar10 == 3) {
LAB_0011e0ad:
          bVar14 = bVar14 | ((long)sVar1 & 2U) == 0 & ((byte)sVar1 ^ 1);
        }
        else if (bVar10 == 1) {
          bVar10 = pTVar8[uVar13].params.field_1.child_count;
          if ((ulong)bVar10 != 0) {
            uVar2 = pTVar8[uVar13].params.field_0.state;
            uVar18 = (ulong)uVar2 << 0x20 | (ulong)bVar10;
            uVar16 = (long)sVar1 & 0xffffffffU |
                     (ulong)pTVar8[uVar13].params.field_1.alias_sequence_id << 0x20;
            for (lVar15 = 0; (ulong)(self->reduce_actions).size << 4 != lVar15;
                lVar15 = lVar15 + 0x10) {
              pRVar5 = (self->reduce_actions).contents;
              if ((*(ushort *)((long)&pRVar5->symbol + lVar15) == uVar2) &&
                 (*(uint *)((long)&pRVar5->count + lVar15) == (uint)bVar10)) goto LAB_0011e0bc;
            }
            array__grow((VoidArray *)&self->reduce_actions,0x10);
            pRVar6 = (self->reduce_actions).contents;
            uVar4 = (self->reduce_actions).size;
            (self->reduce_actions).size = uVar4 + 1;
            pRVar5 = pRVar6 + uVar4;
            pRVar5->count = (int)uVar18;
            pRVar5->symbol = (short)(uVar18 >> 0x20);
            *(short *)&pRVar5->field_0x6 = (short)(uVar18 >> 0x30);
            pRVar6 = pRVar6 + uVar4;
            pRVar6->dynamic_precedence = (int)uVar16;
            pRVar6->alias_sequence_id = (short)(uVar16 >> 0x20);
            *(short *)&pRVar6->field_0xe = (short)(uVar16 >> 0x30);
          }
        }
        else if ((pTVar8[uVar13].field_0x6 & 0xf) == 0) goto LAB_0011e0ad;
LAB_0011e0bc:
      }
    }
    lVar15 = 0xc;
    v1 = 0xffffffff;
    for (; uVar13 < (self->reduce_actions).size; uVar13 = uVar13 + 1) {
      pRVar5 = (self->reduce_actions).contents;
      v1 = ts_parser__reduce(self,version,*(TSSymbol *)((long)pRVar5 + lVar15 + -8),
                             *(uint32_t *)((long)pRVar5 + lVar15 + -0xc),
                             *(int *)((long)pRVar5 + lVar15 + -4),
                             *(uint16_t *)((long)&pRVar5->count + lVar15),true);
      lVar15 = lVar15 + 0x10;
    }
    _Var9 = true;
    if (bVar14 == 0) {
      if (5 < uVar12 || v1 == 0xffffffff) {
        _Var9 = _Var7;
        if (lookahead_symbol != 0) {
          ts_stack_remove_version(self->stack,version);
        }
        goto LAB_0011e206;
      }
      ts_stack_renumber_version(self->stack,v1,version);
    }
    else {
LAB_0011e206:
      bVar19 = version == starting_version;
      version = version + 1;
      _Var7 = _Var9;
      if (bVar19) {
        version = uVar11;
      }
    }
LAB_0011e21e:
    uVar12 = uVar12 + 1;
    uVar11 = (self->stack->heads).size;
  } while( true );
}

Assistant:

static bool ts_parser__do_all_potential_reductions(TSParser *self,
                                                   StackVersion starting_version,
                                                   TSSymbol lookahead_symbol) {
  uint32_t initial_version_count = ts_stack_version_count(self->stack);

  bool can_shift_lookahead_symbol = false;
  StackVersion version = starting_version;
  for (unsigned i = 0; true; i++) {
    uint32_t version_count = ts_stack_version_count(self->stack);
    if (version >= version_count) break;

    bool merged = false;
    for (StackVersion i = initial_version_count; i < version; i++) {
      if (ts_stack_merge(self->stack, i, version)) {
        merged = true;
        break;
      }
    }
    if (merged) continue;

    TSStateId state = ts_stack_state(self->stack, version);
    bool has_shift_action = false;
    array_clear(&self->reduce_actions);

    TSSymbol first_symbol, end_symbol;
    if (lookahead_symbol != 0) {
      first_symbol = lookahead_symbol;
      end_symbol = lookahead_symbol + 1;
    } else {
      first_symbol = 1;
      end_symbol = self->language->token_count;
    }

    for (TSSymbol symbol = first_symbol; symbol < end_symbol; symbol++) {
      TableEntry entry;
      ts_language_table_entry(self->language, state, symbol, &entry);
      for (uint32_t i = 0; i < entry.action_count; i++) {
        TSParseAction action = entry.actions[i];
        switch (action.type) {
          case TSParseActionTypeShift:
          case TSParseActionTypeRecover:
            if (!action.params.extra && !action.params.repetition) has_shift_action = true;
            break;
          case TSParseActionTypeReduce:
            if (action.params.child_count > 0)
              ts_reduce_action_set_add(&self->reduce_actions, (ReduceAction){
                .symbol = action.params.symbol,
                .count = action.params.child_count,
                .dynamic_precedence = action.params.dynamic_precedence,
                .alias_sequence_id = action.params.alias_sequence_id,
              });
          default:
            break;
        }
      }
    }

    StackVersion reduction_version = STACK_VERSION_NONE;
    for (uint32_t i = 0; i < self->reduce_actions.size; i++) {
      ReduceAction action = self->reduce_actions.contents[i];

      reduction_version = ts_parser__reduce(
        self, version, action.symbol, action.count,
        action.dynamic_precedence, action.alias_sequence_id,
        true
      );
    }

    if (has_shift_action) {
      can_shift_lookahead_symbol = true;
    } else if (reduction_version != STACK_VERSION_NONE && i < MAX_VERSION_COUNT) {
      ts_stack_renumber_version(self->stack, reduction_version, version);
      continue;
    } else if (lookahead_symbol != 0) {
      ts_stack_remove_version(self->stack, version);
    }

    if (version == starting_version) {
      version = version_count;
    } else {
      version++;
    }
  }

  return can_shift_lookahead_symbol;
}